

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

uint32_t syncsearch(uint32_t *have,uint8_t *buf,uint32_t len)

{
  uint8_t uVar1;
  uint32_t next;
  uint32_t got;
  uint32_t len_local;
  uint8_t *buf_local;
  uint32_t *have_local;
  
  got = *have;
  for (next = 0; next < len && got < 4; next = next + 1) {
    uVar1 = 0xff;
    if (got < 2) {
      uVar1 = '\0';
    }
    if (buf[next] == uVar1) {
      got = got + 1;
    }
    else if (buf[next] == '\0') {
      got = 4 - got;
    }
    else {
      got = 0;
    }
  }
  *have = got;
  return next;
}

Assistant:

static uint32_t syncsearch(uint32_t *have, const uint8_t *buf, uint32_t len) {
    uint32_t got, next;

    got = *have;
    next = 0;
    while (next < len && got < 4) {
        if ((int)(buf[next]) == (got < 2 ? 0 : 0xff))
            got++;
        else if (buf[next])
            got = 0;
        else
            got = 4 - got;
        next++;
    }
    *have = got;
    return next;
}